

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O0

void serialization::
     unserialize_helper<serialization::xml_iarchive,std::vector<int,std::allocator<int>>>
               (xml_iarchive *ar,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *v)

{
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> tmp;
  size_type i;
  size_type size;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvStack_18;
  serialization_trace trace;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *v_local;
  xml_iarchive *ar_local;
  
  i = 0xa8;
  pvStack_18 = v;
  serialization_trace::serialization_trace<char_const(&)[19],char_const(&)[140],int>
            ((serialization_trace *)((long)&size + 3),(char (*) [19])"unserialize_helper",
             (char (*) [140])
             "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/serialization_helper.h"
             ,(int *)&i);
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = xml_iarchive::load_sequence_start(ar);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::reserve(pvStack_18,
            (ulong)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_end_of_storage._4_4_);
  for (tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (uint)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage <
      tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_;
      tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (uint)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 1) {
    xml_iarchive::load_sequence_item_start
              (ar,(uint)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
    unserialize_helper<serialization::xml_iarchive,int>
              (ar,(vector<int,_std::allocator<int>_> *)local_40);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(pvStack_18,(value_type *)local_40);
    xml_iarchive::load_sequence_item_end(ar);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  }
  xml_iarchive::load_sequence_end(ar);
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::vector<T> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    v.reserve(size);
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        T tmp;
        unserialize_helper(ar, tmp);
        v.push_back(std::move(tmp));
        ar.load_sequence_item_end();
    }

    ar.load_sequence_end();
}